

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>
** __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>
::mutable_child(btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>
                *this,int i)

{
  template_ElementType<3L> *ppbVar1;
  int i_local;
  btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>
  *this_local;
  
  ppbVar1 = btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,256,false>>
            ::GetField<3l>((btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,256,false>>
                            *)this);
  return ppbVar1 + i;
}

Assistant:

btree_node *&mutable_child(int i) { return GetField<3>()[i]; }